

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_benchmark.c
# Opt level: O0

int main(void)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  timespec ts_1;
  roaring_bitmap_t *bm;
  size_t i;
  timespec ts;
  uint64_t cycles_final;
  uint64_t cycles_start;
  size_t N;
  timespec local_50;
  roaring_bitmap_t *local_40;
  ulong local_38;
  timespec local_30;
  long local_20;
  long local_18;
  ulong local_10;
  undefined4 local_4;
  
  local_4 = 0;
  local_10 = 1000000;
  clock_gettime(3,&local_30);
  local_18 = local_30.tv_sec * 1000000000 + local_30.tv_nsec;
  for (local_38 = 0; local_38 < local_10; local_38 = local_38 + 1) {
    local_40 = roaring_bitmap_create();
    roaring_bitmap_free((roaring_bitmap_t *)0x101220);
  }
  clock_gettime(3,&local_50);
  local_20 = local_50.tv_sec * 1000000000 + local_50.tv_nsec;
  lVar1 = local_20 - local_18;
  auVar2._8_4_ = (int)((ulong)lVar1 >> 0x20);
  auVar2._0_8_ = lVar1;
  auVar2._12_4_ = 0x45300000;
  auVar3._8_4_ = (int)(local_10 >> 0x20);
  auVar3._0_8_ = local_10;
  auVar3._12_4_ = 0x45300000;
  printf("%f cycles per object created \n",
         ((auVar2._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) /
         ((auVar3._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)local_10) - 4503599627370496.0)));
  return 0;
}

Assistant:

int main() {
    size_t N = 1000000;
    uint64_t cycles_start, cycles_final;

    RDTSC_START(cycles_start);
    for (size_t i = 0; i < N; i++) {
        roaring_bitmap_t* bm = roaring_bitmap_create();
        roaring_bitmap_free(bm);
    }
    RDTSC_FINAL(cycles_final);
    printf("%f cycles per object created \n",
           (cycles_final - cycles_start) * 1.0 / N);
    return 0;
}